

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_twod_orientation(REF_GRID ref_grid,REF_INT keep,REF_INT remove,REF_BOOL *allowed)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_INT local_d8;
  REF_INT local_d4;
  int local_d0;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL valid;
  REF_BOOL will_be_collapsed;
  REF_INT node;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT remove_local;
  REF_INT keep_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  *allowed = 0;
  ref_cell_00 = ref_grid->cell[3];
  if ((remove < 0) || (ref_cell_00->ref_adj->nnode <= remove)) {
    local_d0 = -1;
  }
  else {
    local_d0 = ref_cell_00->ref_adj->first[remove];
  }
  local_3c = local_d0;
  if (local_d0 == -1) {
    local_d4 = -1;
  }
  else {
    local_d4 = ref_cell_00->ref_adj->item[local_d0].ref;
  }
  local_40 = local_d4;
  while( true ) {
    if (local_3c == -1) {
      *allowed = 1;
      return 0;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,local_40,&will_be_collapsed);
    if (uVar1 != 0) break;
    ref_private_macro_code_rss = 0;
    for (valid = 0; valid < ref_cell_00->node_per; valid = valid + 1) {
      if (keep == (&will_be_collapsed)[valid]) {
        ref_private_macro_code_rss = 1;
      }
    }
    if (ref_private_macro_code_rss == 0) {
      for (valid = 0; valid < ref_cell_00->node_per; valid = valid + 1) {
        if (remove == (&will_be_collapsed)[valid]) {
          (&will_be_collapsed)[valid] = keep;
        }
      }
      uVar1 = ref_node_tri_twod_orientation
                        (ref_node_00,&will_be_collapsed,&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x438,"ref_collapse_edge_twod_orientation",(ulong)uVar1,"valid");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 == 0) {
        return 0;
      }
    }
    local_3c = ref_cell_00->ref_adj->item[local_3c].next;
    if (local_3c == -1) {
      local_d8 = -1;
    }
    else {
      local_d8 = ref_cell_00->ref_adj->item[local_3c].ref;
    }
    local_40 = local_d8;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x428,
         "ref_collapse_edge_twod_orientation",(ulong)uVar1,"nodes");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_twod_orientation(REF_GRID ref_grid,
                                                      REF_INT keep,
                                                      REF_INT remove,
                                                      REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed, valid;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, remove, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (keep == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (remove == nodes[node]) {
        nodes[node] = keep;
      }
    }

    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}